

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db;
  undefined1 auVar1 [16];
  uint uVar2;
  char *pcVar3;
  
  db = pMem->db;
  if (((pMem->flags & 0x9000) != 0) || (pMem->szMalloc != 0)) {
    vdbeMemClear(pMem);
  }
  pcVar3 = (char *)sqlite3DbMallocRawNN(db,0x38);
  if (pcVar3 == (char *)0x0) {
    return 7;
  }
  if ((db != (sqlite3 *)0x0) && (pcVar3 < (db->lookaside).pTrueEnd)) {
    uVar2 = 0x80;
    if ((db->lookaside).pMiddle <= pcVar3) goto LAB_00152e37;
    if ((db->lookaside).pStart <= pcVar3) {
      uVar2 = (uint)(db->lookaside).szTrue;
      goto LAB_00152e37;
    }
  }
  uVar2 = (*sqlite3Config.m.xSize)(pcVar3);
LAB_00152e37:
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(sqlite3 **)(pcVar3 + 8) = db;
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  *(char **)(pcVar3 + 0x20) = pcVar3 + 0x38;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)uVar2 - 0x38;
  *(short *)(pcVar3 + 0x30) = (short)(SUB164(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 4);
  pcVar3[0x32] = '\x01';
  pcVar3[0x33] = '\0';
  pcVar3[0x34] = '\0';
  pcVar3[0x35] = '\0';
  pcVar3[0x36] = '\0';
  pcVar3[0x37] = '\0';
  pMem->z = pcVar3;
  pMem->flags = 0x1010;
  pMem->xDel = sqlite3RowSetDelete;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  RowSet *p;
  assert( db!=0 );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  sqlite3VdbeMemRelease(pMem);
  p = sqlite3RowSetInit(db);
  if( p==0 ) return SQLITE_NOMEM;
  pMem->z = (char*)p;
  pMem->flags = MEM_Blob|MEM_Dyn;
  pMem->xDel = sqlite3RowSetDelete;
  return SQLITE_OK;
}